

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O0

char * seekNewline(char *s,size_t len)

{
  int iVar1;
  bool bVar2;
  int local_24;
  int _len;
  int pos;
  size_t len_local;
  char *s_local;
  
  local_24 = 0;
  iVar1 = (int)len + -1;
  while( true ) {
    if (iVar1 <= local_24) {
      return (char *)0x0;
    }
    while( true ) {
      bVar2 = false;
      if (local_24 < iVar1) {
        bVar2 = s[local_24] != '\r';
      }
      if (!bVar2) break;
      local_24 = local_24 + 1;
    }
    if (local_24 == iVar1) break;
    if (s[local_24 + 1] == '\n') {
      return s + local_24;
    }
    local_24 = local_24 + 1;
  }
  return (char *)0x0;
}

Assistant:

static char *seekNewline(char *s, size_t len) {
    int pos = 0;
    int _len = len-1;

    /* Position should be < len-1 because the character at "pos" should be
     * followed by a \n. Note that strchr cannot be used because it doesn't
     * allow to search a limited length and the buffer that is being searched
     * might not have a trailing NULL character. */
    while (pos < _len) {
        while(pos < _len && s[pos] != '\r') pos++;
        if (pos==_len) {
            /* Not found. */
            return NULL;
        } else {
            if (s[pos+1] == '\n') {
                /* Found. */
                return s+pos;
            } else {
                /* Continue searching. */
                pos++;
            }
        }
    }
    return NULL;
}